

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O3

void __thiscall SoapySDR::ArgInfo::ArgInfo(ArgInfo *this,ArgInfo *param_1)

{
  pointer pcVar1;
  double dVar2;
  double dVar3;
  Type TVar4;
  undefined4 uVar5;
  
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  pcVar1 = (param_1->key)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + (param_1->key)._M_string_length);
  (this->value)._M_dataplus._M_p = (pointer)&(this->value).field_2;
  pcVar1 = (param_1->value)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->value,pcVar1,pcVar1 + (param_1->value)._M_string_length);
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (param_1->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + (param_1->name)._M_string_length);
  (this->description)._M_dataplus._M_p = (pointer)&(this->description).field_2;
  pcVar1 = (param_1->description)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->description,pcVar1,pcVar1 + (param_1->description)._M_string_length);
  (this->units)._M_dataplus._M_p = (pointer)&(this->units).field_2;
  pcVar1 = (param_1->units)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->units,pcVar1,pcVar1 + (param_1->units)._M_string_length);
  TVar4 = param_1->type;
  uVar5 = *(undefined4 *)&param_1->field_0xa4;
  dVar2 = (param_1->range)._min;
  dVar3 = (param_1->range)._step;
  (this->range)._max = (param_1->range)._max;
  (this->range)._step = dVar3;
  this->type = TVar4;
  *(undefined4 *)&this->field_0xa4 = uVar5;
  (this->range)._min = dVar2;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->options,&param_1->options);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->optionNames,&param_1->optionNames);
  return;
}

Assistant:

class SOAPY_SDR_API ArgInfo
{
public:

    //! Default constructor
    ArgInfo(void);

    //! The key used to identify the argument (required)
    std::string key;

    /*!
     * The default value of the argument when not specified (required)
     * Numbers should use standard floating point and integer formats.
     * Boolean values should be represented as "true" and  "false".
     */
    std::string value;

    //! The displayable name of the argument (optional, use key if empty)
    std::string name;

    //! A brief description about the argument (optional)
    std::string description;

    //! The units of the argument: dB, Hz, etc (optional)
    std::string units;

    //! The data type of the argument (required)
    enum Type {BOOL, INT, FLOAT, STRING} type;

    /*!
     * The range of possible numeric values (optional)
     * When specified, the argument should be restricted to this range.
     * The range is only applicable to numeric argument types.
     */
    Range range;

    /*!
     * A discrete list of possible values (optional)
     * When specified, the argument should be restricted to this options set.
     */
    std::vector<std::string> options;

    /*!
     * A discrete list of displayable names for the enumerated options (optional)
     * When not specified, the option value itself can be used as a display name.
     */
    std::vector<std::string> optionNames;
}